

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DropTrigger(Parse *pParse,SrcList *pName,int noErr)

{
  sqlite3 *db;
  char *zRight;
  char *pKey;
  int iVar1;
  uint uVar2;
  int iVar3;
  HashElem *pHVar4;
  Trigger *pTrigger;
  uint uVar5;
  bool bVar6;
  
  db = pParse->db;
  if ((db->mallocFailed == '\0') && (iVar1 = sqlite3ReadSchema(pParse), iVar1 == 0)) {
    zRight = pName->a[0].zDatabase;
    iVar1 = db->nDb;
    if (iVar1 < 1) {
      pTrigger = (Trigger *)0x0;
    }
    else {
      pKey = pName->a[0].zName;
      pTrigger = (Trigger *)0x0;
      uVar5 = 0;
      do {
        uVar2 = uVar5 < 2 ^ uVar5;
        if ((zRight == (char *)0x0) ||
           (iVar3 = sqlite3StrICmp(db->aDb[uVar2].zDbSName,zRight), iVar3 == 0)) {
          pHVar4 = findElementWithHash(&(db->aDb[uVar2].pSchema)->trigHash,pKey,(uint *)0x0);
          pTrigger = (Trigger *)pHVar4->data;
          bVar6 = pTrigger != (Trigger *)0x0;
        }
        else {
          bVar6 = false;
        }
      } while ((!bVar6) && (bVar6 = iVar1 - 1U != uVar5, uVar5 = uVar5 + 1, bVar6));
    }
    if (pTrigger == (Trigger *)0x0) {
      if (noErr == 0) {
        sqlite3ErrorMsg(pParse,"no such trigger: %S",pName,0);
      }
      else {
        sqlite3CodeVerifyNamedSchema(pParse,zRight);
      }
      pParse->checkSchema = '\x01';
    }
    else {
      sqlite3DropTriggerPtr(pParse,pTrigger);
    }
  }
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTrigger(Parse *pParse, SrcList *pName, int noErr){
  Trigger *pTrigger = 0;
  int i;
  const char *zDb;
  const char *zName;
  sqlite3 *db = pParse->db;

  if( db->mallocFailed ) goto drop_trigger_cleanup;
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto drop_trigger_cleanup;
  }

  assert( pName->nSrc==1 );
  zDb = pName->a[0].zDatabase;
  zName = pName->a[0].zName;
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    if( zDb && sqlite3StrICmp(db->aDb[j].zDbSName, zDb) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    pTrigger = sqlite3HashFind(&(db->aDb[j].pSchema->trigHash), zName);
    if( pTrigger ) break;
  }
  if( !pTrigger ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "no such trigger: %S", pName, 0);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, zDb);
    }
    pParse->checkSchema = 1;
    goto drop_trigger_cleanup;
  }
  sqlite3DropTriggerPtr(pParse, pTrigger);

drop_trigger_cleanup:
  sqlite3SrcListDelete(db, pName);
}